

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniball.hpp
# Opt level: O2

void __thiscall
Miniball::
Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
::pivot_mb(Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_const_float_*>_>
           *this,Pit n)

{
  float fVar1;
  bool bVar2;
  float **ppfVar3;
  _List_iterator<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>_>
  _Var4;
  int iVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  Pit local_40;
  undefined1 local_38 [16];
  
  local_38._0_4_ = this->current_sqr_r;
  do {
    ppfVar3 = (this->points_begin)._M_current;
    fVar1 = this->nt0;
    fVar7 = fVar1;
    local_40._M_current = ppfVar3;
    iVar5 = this->d;
    if (this->d < 1) {
      iVar5 = 0;
    }
    for (; ppfVar3 != n._M_current; ppfVar3 = ppfVar3 + 1) {
      fVar8 = -(float)local_38._0_4_;
      for (lVar6 = 0; iVar5 != (int)lVar6; lVar6 = lVar6 + 1) {
        fVar9 = (*ppfVar3)[lVar6] - this->current_c[lVar6];
        fVar8 = fVar8 + fVar9 * fVar9;
      }
      if (fVar7 < fVar8) {
        fVar7 = fVar8;
        local_40._M_current = ppfVar3;
      }
    }
    if (fVar1 < fVar7) {
      local_38 = ZEXT416((uint)local_38._0_4_);
      _Var4 = std::
              __find_if<std::_List_iterator<__gnu_cxx::__normal_iterator<float_const*const*,std::vector<float_const*,std::allocator<float_const*>>>>,__gnu_cxx::__ops::_Iter_equals_val<__gnu_cxx::__normal_iterator<float_const*const*,std::vector<float_const*,std::allocator<float_const*>>>const>>
                        ((this->L).
                         super__List_base<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_float_*const_*,_std::vector<const_float_*,_std::allocator<const_float_*>_>_>_>_>
                         ._M_impl._M_node.super__List_node_base._M_next,(this->support_end)._M_node,
                         &local_40);
      if (_Var4._M_node == (this->support_end)._M_node) {
        if (this->fsize != 0) {
          __assert_fail("fsize == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/xinyandai[P]exactNNS/include/kmeans/../miniball/miniball.hpp"
                        ,0x18a,
                        "void Miniball::Miniball<Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>>::pivot_mb(Pit) [CoordAccessor = Miniball::CoordAccessor<__gnu_cxx::__normal_iterator<const float *const *, std::vector<const float *>>, const float *>]"
                       );
        }
        bVar2 = push(this,local_40);
        if (bVar2) {
          mtf_mb(this,(this->support_end)._M_node);
          this->fsize = this->fsize + -1;
          pivot_move_to_front(this,local_40);
        }
      }
    }
    bVar2 = (float)local_38._0_4_ < this->current_sqr_r;
    local_38._0_4_ = this->current_sqr_r;
  } while (bVar2);
  return;
}

Assistant:

void Miniball<CoordAccessor>::pivot_mb (Pit n)
    {
        // Algorithm 2: pivot_mb (L_{n-1}), where L_{n-1} = [L.begin, n)
        // --------------------------------------------------------------
        // from B. Gaertner, Fast and Robust Smallest Enclosing Balls, ESA 1999,
        // http://www.inf.ethz.ch/personal/gaertner/texts/own_work/esa99_final.pdf
        NT          old_sqr_r;
        const NT*   c;
        Pit         pivot, k;
        NT          e, max_e, sqr_r;
        Cit p;
        do {
            old_sqr_r = current_sqr_r;
            sqr_r = current_sqr_r;

            pivot = points_begin;
            max_e = nt0;
            for (k = points_begin; k != n; ++k) {
                p = coord_accessor(k);
                e = -sqr_r;
                c = current_c;
                for (int j=0; j<d; ++j)
                    e += mb_sqr<NT>(*p++-*c++);
                if (e > max_e) {
                    max_e = e;
                    pivot = k;
                }
            }

            if (max_e > nt0) {
                // check if the pivot is already contained in the support set
                if (std::find(L.begin(), support_end, pivot) == support_end) {
                    assert (fsize == 0);
                    if (push (pivot)) {
                        mtf_mb(support_end);
                        pop();
                        pivot_move_to_front(pivot);
                    }
                }
            }
        } while (old_sqr_r < current_sqr_r);
    }